

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsTagAddDescriptions
              (FmsTag tag,FmsIntType tag_type,void *tags,char **tag_descr,FmsInt num_tags)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  char *str;
  void *pvVar4;
  long in_RCX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  char **in_R8;
  FmsInt i;
  FmsInt nc;
  size_t sizeof_tag_type;
  char **tag_descriptions;
  char *described_tags;
  FmsInt num_tag_descriptions;
  FmsInt in_stack_000001e0;
  void *in_stack_000001e8;
  FmsIntType in_stack_000001f4;
  void *in_stack_000001f8;
  FmsIntType in_stack_00000200;
  char **str_copy_p;
  void *local_48;
  
  if (in_RDI == 0) {
    return 1;
  }
  if (7 < in_ESI) {
    return 2;
  }
  if (*(int *)(in_RDI + 0x18) == 8) {
    return 3;
  }
  if (in_R8 == (char **)0x0) {
    return 0;
  }
  if (in_RDX == 0) {
    return 4;
  }
  if (in_RCX == 0) {
    return 5;
  }
  uVar1 = *(ulong *)(in_RDI + 0x10);
  pvVar4 = *(void **)(in_RDI + 0x28);
  local_48 = *(void **)(in_RDI + 0x30);
  sVar2 = FmsIntTypeSize[*(uint *)(in_RDI + 0x18)];
  str = (char *)NextPow2(uVar1 + (long)in_R8);
  if (uVar1 <= (ulong)str >> 1) {
    pvVar4 = realloc(pvVar4,(long)str * sVar2);
    if (pvVar4 == (void *)0x0) {
      return 6;
    }
    *(void **)(in_RDI + 0x28) = pvVar4;
    local_48 = realloc(local_48,(long)str << 3);
    if (local_48 == (void *)0x0) {
      return 6;
    }
    *(void **)(in_RDI + 0x30) = local_48;
  }
  FmsIntConvertCopy(in_stack_00000200,in_stack_000001f8,in_stack_000001f4,in_stack_000001e8,
                    in_stack_000001e0);
  str_copy_p = (char **)0x0;
  while( true ) {
    if (in_R8 <= str_copy_p) {
      *(ulong *)(in_RDI + 0x10) = uVar1 + (long)in_R8;
      return 0;
    }
    iVar3 = FmsCopyString(str,str_copy_p);
    if (iVar3 != 0) break;
    str_copy_p = (char **)((long)str_copy_p + 1);
  }
  while (str_copy_p != (char **)0x0) {
    str_copy_p = (char **)((long)str_copy_p + -1);
    free(*(void **)((long)local_48 + (uVar1 + (long)str_copy_p) * 8));
  }
  return 6;
}

Assistant:

int FmsTagAddDescriptions(FmsTag tag, FmsIntType tag_type, const void *tags,
                          const char *const *tag_descr, FmsInt num_tags) {
  if (!tag) { E_RETURN(1); }
  if (tag_type >= FMS_NUM_INT_TYPES) { E_RETURN(2); }
  if (tag->tag_type == FMS_NUM_INT_TYPES) { E_RETURN(3); }
  if (num_tags == 0) { return 0; }
  if (tags == NULL) { E_RETURN(4); }
  if (tag_descr == NULL) { E_RETURN(5); }
  const FmsInt num_tag_descriptions = tag->num_tag_descriptions;
  char *described_tags = tag->described_tags;
  char **tag_descriptions = tag->tag_descriptions;
  const size_t sizeof_tag_type = FmsIntTypeSize[tag->tag_type];
  const FmsInt nc = NextPow2(num_tag_descriptions + num_tags);
  if (num_tag_descriptions <= nc/2) {
    described_tags = realloc(described_tags, nc*sizeof_tag_type);
    if (described_tags == NULL) { E_RETURN(6); }
    tag->described_tags = described_tags;
    tag_descriptions = realloc(tag_descriptions, nc*sizeof(char*));
    if (tag_descriptions == NULL) { E_RETURN(6); }
    tag->tag_descriptions = tag_descriptions;
  }
  // Copy the new described tags
  FmsIntConvertCopy(tag_type, tags, tag->tag_type,
                    described_tags + num_tag_descriptions*sizeof_tag_type,
                    num_tags);
  // Copy the new description strings
  for (FmsInt i = 0; i < num_tags; i++) {
    if (FmsCopyString(tag_descr[i],
                      &tag_descriptions[num_tag_descriptions + i])) {
      while (i != 0) {
        free(tag_descriptions[num_tag_descriptions + (--i)]);
      }
      E_RETURN(6);
    }
  }
  // Update tag
  tag->num_tag_descriptions = num_tag_descriptions + num_tags;
  return 0;
}